

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O1

void __thiscall HighsHashTree<int,_void>::InnerLeaf<4>::rehash(InnerLeaf<4> *this,int hashPos)

{
  long lVar1;
  int iVar2;
  unsigned_long uVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  uint64_t hash;
  int i;
  int local_30;
  int local_2c;
  
  (this->occupation).occupation = 0;
  iVar2 = this->size;
  if (0 < (long)iVar2) {
    uVar7 = (this->occupation).occupation;
    lVar8 = 0;
    do {
      uVar9 = (ulong)(uint)(this->entries)._M_elems[lVar8].value_;
      uVar9 = (uVar9 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20 ^
              uVar9 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32) >>
              ((char)hashPos * -6 + 0x30U & 0x3f);
      (this->hashes)._M_elems[lVar8] = uVar9 & 0xffff;
      uVar7 = uVar7 | 1L << (uVar9 >> 10 & 0x3f);
      lVar8 = lVar8 + 1;
    } while (iVar2 != lVar8);
    (this->occupation).occupation = uVar7;
  }
  local_2c = 0;
  if (0 < this->size) {
    do {
      lVar8 = (long)local_2c;
      uVar7 = (this->hashes)._M_elems[lVar8];
      local_30 = (int)POPCOUNT((this->occupation).occupation >> ((byte)(uVar7 >> 10) & 0x3f)) + -1;
      if (local_2c < local_30) {
        uVar3 = (this->hashes)._M_elems[local_30];
        (this->hashes)._M_elems[local_30] = uVar7;
        (this->hashes)._M_elems[lVar8] = uVar3;
        iVar2 = (this->entries)._M_elems[local_30].value_;
        (this->entries)._M_elems[local_30].value_ = (this->entries)._M_elems[lVar8].value_;
        (this->entries)._M_elems[lVar8].value_ = iVar2;
      }
      else {
        bVar4 = local_30 < local_2c;
        if (local_30 < local_2c) {
          if (uVar7 <= (this->hashes)._M_elems[local_30]) {
            lVar6 = (long)local_30;
            do {
              if (local_2c + -1 == (int)lVar6) goto LAB_00278cdd;
              lVar1 = lVar6 + 1;
              lVar5 = lVar6 + 1;
              lVar6 = lVar1;
            } while (uVar7 <= (this->hashes)._M_elems[lVar5]);
            local_30 = (int)lVar1;
            bVar4 = lVar1 < lVar8;
          }
          if (bVar4) {
            iVar2 = (this->entries)._M_elems[lVar8].value_;
            move_backward(this,&local_30,&local_2c);
            (this->hashes)._M_elems[local_30] = uVar7;
            (this->entries)._M_elems[local_30].value_ = iVar2;
          }
        }
LAB_00278cdd:
        local_2c = local_2c + 1;
      }
    } while (local_2c < this->size);
  }
  return;
}

Assistant:

void rehash(int hashPos) {
      // function needs to possibly reorder elements by a different hash value
      // chances are very high we are already ordered correctly as we use 16
      // bits of the hash and one level is uses 6 bits, so the new values
      // are guaranteed to be ordered correctly by their 10 most significant
      // bits if increasing the hash position by 1 and only if the 10 bits of
      // the hash had a collision the new 6 bits might break a tie differently.
      // It is, however, important to maintain the exact ordering as otherwise
      // elements may not be found.
      occupation = 0;
      for (int i = 0; i < size; ++i) {
        hashes[i] = get_hash_chunks16(compute_hash(entries[i].key()), hashPos);
        occupation.set(get_first_chunk16(hashes[i]));
      }

      int i = 0;
      while (i < size) {
        uint8_t hashChunk = get_first_chunk16(hashes[i]);
        int pos = occupation.num_set_until(hashChunk) - 1;

        // if the position is after i the element definitely comes later, so we
        // swap it to that position and proceed without increasing i until
        // eventually an element appears that comes at position i or before
        if (pos > i) {
          std::swap(hashes[pos], hashes[i]);
          std::swap(entries[pos], entries[i]);
          continue;
        }

        // the position is before or at i, now check where the exact location
        // should be for the ordering by hash so that the invariant is that all
        // elements up to i are properly sorted. Essentially insertion sort but
        // with the modification of having a high chance to guess the correct
        // position already using the occupation flags.
        while (pos < i && hashes[pos] >= hashes[i]) ++pos;

        // if the final position is before i we need to move elements to
        // make space at that position, otherwise nothing needs to be done but
        // incrementing i increasing the sorted range by 1.
        if (pos < i) {
          uint64_t hash = hashes[i];
          auto entry = std::move(entries[i]);
          move_backward(pos, i);
          hashes[pos] = hash;
          entries[pos] = std::move(entry);
        }
        ++i;
      }
    }